

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPIfClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPIfClause *this)

{
  string clause_string;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"if ","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"(","");
  if (this->modifier < OMPC_IF_MODIFIER_unspecified) {
    std::__cxx11::string::append((char *)&local_60);
  }
  if (1 < local_58) {
    std::__cxx11::string::append((char *)&local_60);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_40,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_60);
  if (2 < local_58) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPIfClause::toString() {

    std::string result = "if ";
    std::string clause_string = "(";
    OpenMPIfClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_IF_MODIFIER_parallel:
            clause_string += "parallel";
            break;
        case OMPC_IF_MODIFIER_simd:
            clause_string += "simd";
            break;
        case OMPC_IF_MODIFIER_task:
            clause_string += "task";
            break;
        case OMPC_IF_MODIFIER_taskloop:
            clause_string += "taskloop";
            break;
        case OMPC_IF_MODIFIER_cancel:
            clause_string += "cancel";
            break;
        case OMPC_IF_MODIFIER_target_data:
            clause_string += "target data";
            break;
        case OMPC_IF_MODIFIER_target_enter_data:
            clause_string += "target enter data";
            break;
        case OMPC_IF_MODIFIER_target_exit_data:
            clause_string += "target exit data";
            break;
        case OMPC_IF_MODIFIER_target:
            clause_string += "target";
            break;
        case OMPC_IF_MODIFIER_target_update:
            clause_string += "target update";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ": ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 2) {
        result += clause_string;
    };

    return result;
}